

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd_decode.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **args;
  value_t vVar1;
  json_value jVar2;
  json_value __n;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  reference pvVar8;
  char *pcVar9;
  char *decoding;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  object_t *poVar13;
  undefined4 uVar14;
  bool bVar15;
  unsigned_long_long random_seed;
  json_value __n_00;
  double dVar16;
  json output;
  json json_input;
  string osd_method;
  string bp_method;
  string logical_check_method;
  string p_label;
  string label;
  int ret;
  bp_osd hx_bp_osd;
  timing time;
  stringstream output_filename;
  ifstream json_input_file;
  MTRand r;
  undefined1 local_2130 [16];
  undefined1 local_2120 [8];
  json_value local_2118;
  object_t *local_2110;
  json_value local_2108;
  json_value local_2100;
  value_t local_20f8;
  json_value local_20f0;
  value_t local_20e8;
  json_value local_20e0;
  value_t local_20d8;
  json_value local_20d0;
  mod2sparse *local_20c8;
  mod2sparse *local_20c0;
  object_t *local_20b8;
  json_value local_20b0;
  value_t local_20a8;
  json_value local_20a0;
  value_t local_2098;
  json_value local_2090;
  double local_2088;
  double dStack_2080;
  value_t local_2070;
  json_value local_2068;
  value_t local_2060;
  json_value local_2058;
  value_t local_2050;
  json_value local_2048;
  value_t local_2040;
  json_value local_2038;
  value_t local_2030;
  json_value local_2028;
  mod2sparse *local_2020;
  json_value local_2018;
  double local_2010;
  string_t local_2008;
  value_t local_1fe8;
  json_value local_1fe0;
  value_t local_1fd8;
  json_value local_1fd0;
  value_t local_1fc8;
  json_value local_1fc0;
  value_t local_1fb8;
  json_value local_1fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fa8;
  char *local_1f88;
  json_value local_1f80;
  number_float_t local_1f78;
  number_float_t local_1f70;
  value_t local_1f68;
  json_value local_1f60;
  value_t local_1f58;
  json_value local_1f50;
  value_t local_1f48;
  json_value local_1f40;
  value_t local_1f38;
  json_value local_1f30;
  value_t local_1f28;
  json_value local_1f20;
  value_t local_1f18;
  json_value local_1f10;
  value_t local_1f08;
  json_value local_1f00;
  value_t local_1ef8;
  json_value local_1ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ee8;
  value_t local_1ec8;
  json_value local_1ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1eb8;
  value_t local_1e98;
  json_value local_1e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e88;
  undefined8 local_1e68;
  object_t *local_1e60;
  double local_1e58;
  undefined1 local_1e50 [16];
  undefined1 local_1e40 [16];
  undefined1 local_1e30 [16];
  undefined1 local_1e20 [16];
  undefined1 local_1e10 [16];
  undefined1 local_1e00 [16];
  undefined1 local_1df0 [16];
  undefined1 local_1de0 [16];
  undefined1 local_1dd0 [16];
  undefined1 local_1dc0 [16];
  undefined1 local_1db0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1da0;
  long local_1d90 [2];
  string local_1d80;
  long *local_1d60 [2];
  long local_1d50 [2];
  string local_1d40;
  long *local_1d20 [2];
  long local_1d10 [2];
  string local_1d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce0;
  long *local_1cc0 [2];
  long local_1cb0 [2];
  string local_1ca0;
  long *local_1c80 [2];
  long local_1c70 [2];
  string local_1c60;
  long *local_1c40 [2];
  long local_1c30 [2];
  string local_1c20;
  long *local_1c00 [2];
  long local_1bf0 [2];
  string local_1be0;
  long *local_1bc0 [2];
  long local_1bb0 [2];
  string local_1ba0;
  long *local_1b80 [2];
  long local_1b70 [2];
  string local_1b60;
  long *local_1b40 [2];
  long local_1b30 [2];
  string local_1b20;
  long *local_1b00 [2];
  long local_1af0 [2];
  string local_1ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a80;
  json_value local_1a60;
  json_value local_1a58;
  object_t local_1a50 [4];
  ios_base local_1968 [264];
  bp_osd local_1860;
  timing local_17e8;
  undefined8 local_1748;
  long local_1738 [14];
  ios_base local_16c8 [264];
  istream local_15c0 [520];
  undefined1 local_13b8 [8];
  json_value local_13b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13a8 [311];
  
  if (argv[1] == (char *)0x0) {
    pcVar9 = "ERROR: Please provide a location for the input directory";
  }
  else {
    if (argv[2] != (char *)0x0) {
      args = argv + 1;
      timing::timing(&local_17e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start time: ",0xc);
      if (local_17e8.start_time_string == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x132238);
      }
      else {
        sVar6 = strlen(local_17e8.start_time_string);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_17e8.start_time_string,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input file: ",0xc);
      pcVar9 = *args;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x132238);
      }
      else {
        sVar6 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      local_2108.number_float = timing::elapsed_time_seconds(&local_17e8);
      std::ifstream::ifstream(local_15c0,*args,_S_in);
      local_2120[0] = null;
      local_2118.object = (object_t *)0x0;
      nlohmann::operator>>
                (local_15c0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_2120);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump((string_t *)local_13b8,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_2120,1,' ',false,strict);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)CONCAT71(local_13b8._1_7_,local_13b8[0]),
                          local_13b0.number_integer);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((undefined1 *)CONCAT71(local_13b8._1_7_,local_13b8[0]) != local_13b8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_13b8._1_7_,local_13b8[0]),
                        local_13a8[0]._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2130,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2120);
      local_1fb0.object = (object_t *)0x0;
      local_1fb8 = string;
      local_1fb0.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::create<std::__cxx11::string,char*const&>(args);
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_2130,"input_file");
      vVar1 = pvVar8->m_type;
      pvVar8->m_type = local_1fb8;
      jVar2 = pvVar8->m_value;
      (pvVar8->m_value).object = (object_t *)local_1fb0;
      local_1fb8 = vVar1;
      local_1fb0 = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1fb0.boolean,vVar1);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1db0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2130);
      local_1ae0._M_dataplus._M_p = (pointer)&local_1ae0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ae0,"input_seed","");
      local_1b00[0] = local_1af0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b00,"0","");
      json_read_safe((json *)local_13b8,(string *)local_1db0,&local_1ae0);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_13b8,(int *)&local_1a60.number_integer);
      random_seed = (unsigned_long_long)(int)local_1a60.number_integer._0_4_;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_13b8 + 8),local_13b8[0]);
      if (local_1b00[0] != local_1af0) {
        operator_delete(local_1b00[0],local_1af0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ae0._M_dataplus._M_p != &local_1ae0.field_2) {
        operator_delete(local_1ae0._M_dataplus._M_p,local_1ae0.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1db0 + 8),local_1db0[0]);
      setup_mtwister_rng((MTRand *)local_13b8,random_seed);
      local_1fc0.object = (object_t *)0x0;
      local_1fc8 = string;
      local_1fc0.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::create<std::__cxx11::string,char*const&>(&local_17e8.start_time_string);
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_2130,"start_time");
      vVar1 = pvVar8->m_type;
      pvVar8->m_type = local_1fc8;
      jVar2 = pvVar8->m_value;
      (pvVar8->m_value).object = (object_t *)local_1fc0;
      local_1fc8 = vVar1;
      local_1fc0 = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1fc0.boolean,vVar1);
      local_1e90.object = (object_t *)((long)local_17e8.start_time_seconds + random_seed);
      local_1e98 = number_unsigned;
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_2130,"ui");
      vVar1 = pvVar8->m_type;
      pvVar8->m_type = local_1e98;
      jVar2 = pvVar8->m_value;
      (pvVar8->m_value).object = (object_t *)local_1e90;
      local_1e98 = vVar1;
      local_1e90 = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1e90.boolean,vVar1);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1dc0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2120);
      local_1b20._M_dataplus._M_p = (pointer)&local_1b20.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b20,"bit_error_rate","");
      local_1b40[0] = local_1b30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b40,"0","");
      json_read_safe((json *)&local_1a60,(string *)local_1dc0,&local_1b20);
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&local_1a60,(double *)&local_1748);
      local_2010 = (double)CONCAT44(local_1748._4_4_,(int)local_1748);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
      if (local_1b40[0] != local_1b30) {
        operator_delete(local_1b40[0],local_1b30[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b20._M_dataplus._M_p != &local_1b20.field_2) {
        operator_delete(local_1b20._M_dataplus._M_p,local_1b20.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1dc0 + 8),local_1dc0[0]);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1dd0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2120);
      local_1b60._M_dataplus._M_p = (pointer)&local_1b60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b60,"osd_order","");
      local_1b80[0] = local_1b70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b80,"0","");
      json_read_safe((json *)&local_1a60,(string *)local_1dd0,&local_1b60);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&local_1a60,(int *)&local_1748);
      iVar5 = (int)local_1748;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
      if (local_1b80[0] != local_1b70) {
        operator_delete(local_1b80[0],local_1b70[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b60._M_dataplus._M_p != &local_1b60.field_2) {
        operator_delete(local_1b60._M_dataplus._M_p,local_1b60.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1dd0 + 8),local_1dd0[0]);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1de0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2120);
      local_1ba0._M_dataplus._M_p = (pointer)&local_1ba0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ba0,"max_iter","");
      local_1bc0[0] = local_1bb0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1bc0,"0","");
      json_read_safe((json *)&local_1a60,(string *)local_1de0,&local_1ba0);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&local_1a60,(int *)&local_1748);
      iVar4 = (int)local_1748;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
      if (local_1bc0[0] != local_1bb0) {
        operator_delete(local_1bc0[0],local_1bb0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ba0._M_dataplus._M_p != &local_1ba0.field_2) {
        operator_delete(local_1ba0._M_dataplus._M_p,local_1ba0.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1de0 + 8),local_1de0[0]);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1df0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2120);
      local_1be0._M_dataplus._M_p = (pointer)&local_1be0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1be0,"target_runs","");
      local_1c00[0] = local_1bf0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c00,"0","");
      json_read_safe((json *)&local_1a60,(string *)local_1df0,&local_1be0);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long_long,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&local_1a60,&local_1748);
      local_20b8 = (object_t *)CONCAT44(local_1748._4_4_,(int)local_1748);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
      if (local_1c00[0] != local_1bf0) {
        operator_delete(local_1c00[0],local_1bf0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1be0._M_dataplus._M_p != &local_1be0.field_2) {
        operator_delete(local_1be0._M_dataplus._M_p,local_1be0.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1df0 + 8),local_1df0[0]);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_1e00,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2120);
      local_1c20._M_dataplus._M_p = (pointer)&local_1c20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c20,"logical_check_method","");
      local_1c40[0] = local_1c30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c40,"lx","");
      json_read_safe((json *)&local_1a60,(string *)local_1e00,&local_1c20);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_1eb8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&local_1a60);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
      if (local_1c40[0] != local_1c30) {
        operator_delete(local_1c40[0],local_1c30[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c20._M_dataplus._M_p != &local_1c20.field_2) {
        operator_delete(local_1c20._M_dataplus._M_p,local_1c20.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_1e00 + 8),local_1e00[0]);
      iVar3 = std::__cxx11::string::compare((char *)&local_1eb8);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_1eb8), iVar3 == 0))
      {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1e10,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2120);
        local_1c60._M_dataplus._M_p = (pointer)&local_1c60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c60,"osd_method","");
        local_1c80[0] = local_1c70;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c80,"0","");
        json_read_safe((json *)&local_1a60,(string *)local_1e10,&local_1c60);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1fa8,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_1a60);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
        if (local_1c80[0] != local_1c70) {
          operator_delete(local_1c80[0],local_1c70[0] + 1);
        }
        local_2110 = (object_t *)CONCAT44(local_2110._4_4_,iVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
          operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_1e10 + 8),local_1e10[0]);
        iVar4 = std::__cxx11::string::compare((char *)&local_1fa8);
        uVar14 = 0;
        if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_1fa8), iVar4 != 0)
           ) {
          iVar4 = std::__cxx11::string::compare((char *)&local_1fa8);
          uVar14 = 1;
          if ((iVar4 != 0) &&
             (iVar4 = std::__cxx11::string::compare((char *)&local_1fa8), iVar4 != 0)) {
            iVar4 = std::__cxx11::string::compare((char *)&local_1fa8);
            if (iVar4 == 0) {
              local_1ec0.object = (object_t *)0x0;
              local_1ec8 = number_integer;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"osd_order");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_1ec8;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).object = (object_t *)local_1ec0;
              local_1ec8 = vVar1;
              local_1ec0 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_1ec0.boolean,vVar1);
              uVar14 = 2;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_1fa8);
              uVar14 = 3;
              if (iVar4 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"ERROR: Invalid OSD method: ",0x1b);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_1fa8._M_dataplus._M_p,
                                    local_1fa8._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_00113ba2;
              }
            }
          }
        }
        if (iVar5 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1fa8,0,(char *)local_1fa8._M_string_length,0x1267b8);
          local_1fd0.object = (object_t *)0x0;
          local_1fd8 = string;
          local_1fd0.object =
               (object_t *)
               nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::create<std::__cxx11::string,std::__cxx11::string_const&>(&local_1fa8);
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_2130,"osd_method");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1fd8;
          jVar2 = pvVar8->m_value;
          (pvVar8->m_value).object = (object_t *)local_1fd0;
          local_1fd8 = vVar1;
          local_1fd0 = jVar2;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1fd0.boolean,vVar1);
          uVar14 = 2;
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1e20,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2120);
        local_2100.number_integer._0_4_ = uVar14;
        local_1ca0._M_dataplus._M_p = (pointer)&local_1ca0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ca0,"bp_method","");
        local_1cc0[0] = local_1cb0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1cc0,"min_sum","");
        json_read_safe((json *)&local_1a60,(string *)local_1e20,&local_1ca0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1ee8,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_1a60);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
        if (local_1cc0[0] != local_1cb0) {
          operator_delete(local_1cc0[0],local_1cb0[0] + 1);
        }
        poVar13 = local_20b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
          operator_delete(local_1ca0._M_dataplus._M_p,local_1ca0.field_2._M_allocated_capacity + 1);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_1e20 + 8),local_1e20[0]);
        iVar4 = std::__cxx11::string::compare((char *)&local_1ee8);
        if (iVar4 == 0) {
          iVar4 = 0;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_1ee8);
          if (iVar4 == 0) {
            iVar4 = 1;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_1ee8);
            if (iVar4 == 0) {
              iVar4 = 2;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_1ee8);
              iVar4 = 3;
              if (iVar3 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"ERROR: Invalid BP method: ",0x1a);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_1ee8._M_dataplus._M_p,
                                    local_1ee8._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_00113ba2;
              }
            }
          }
        }
        local_1fe0.object = (object_t *)0x0;
        local_1fe8 = string;
        local_1fe0.object =
             (object_t *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,std::__cxx11::string_const&>(&local_1ee8);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_2130,"bp_method");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1fe8;
        jVar2 = pvVar8->m_value;
        (pvVar8->m_value).object = (object_t *)local_1fe0;
        local_1fe8 = vVar1;
        local_1fe0 = jVar2;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1fe0.boolean,vVar1);
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_1e88,vsnprintf,0x148,"%f",local_2010);
        if (local_1e88._M_string_length != 0) {
          sVar10 = 0;
          do {
            if (local_1e88._M_dataplus._M_p[sVar10] == '.') {
              local_1e88._M_dataplus._M_p[sVar10] = '_';
            }
            sVar10 = sVar10 + 1;
          } while (local_1e88._M_string_length != sVar10);
        }
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_2130,"code_label");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1ce0,pvVar8);
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1748);
        pcVar9 = argv[2];
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)(ostream *)local_1738 + (int)*(undefined8 *)(local_1738[0] + -0x18));
        }
        else {
          sVar6 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1738,pcVar9,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1738,"/",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1738,local_1ce0._M_dataplus._M_p,
                            local_1ce0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";p:",3);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_1e88._M_dataplus._M_p,local_1e88._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";ui:",4);
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".json",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nOutput filename: ",0x12);
        std::__cxx11::stringbuf::str();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1a60.object,
                            local_1a58.number_integer);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_1a60.object != local_1a50) {
          operator_delete(local_1a60.object,local_1a50[0]._M_t._M_impl._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nLoading alist files",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1e30,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2120);
        local_1d00._M_dataplus._M_p = (pointer)&local_1d00.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d00,"hx_filename","");
        local_1d20[0] = local_1d10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d20,"0","");
        json_read_safe((json *)&local_1a60,(string *)local_1e30,&local_1d00);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1a80,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_1a60);
        local_2020 = load_alist_cpp(&local_1a80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a80._M_dataplus._M_p != &local_1a80.field_2) {
          operator_delete(local_1a80._M_dataplus._M_p,local_1a80.field_2._M_allocated_capacity + 1);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
        if (local_1d20[0] != local_1d10) {
          operator_delete(local_1d20[0],local_1d10[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d00._M_dataplus._M_p != &local_1d00.field_2) {
          operator_delete(local_1d00._M_dataplus._M_p,local_1d00.field_2._M_allocated_capacity + 1);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_1e30 + 8),local_1e30[0]);
        __n_00 = (json_value)(long)local_2020->n_rows;
        local_2018 = (json_value)(long)local_2020->n_cols;
        local_1ef8 = number_integer;
        local_1ef0 = local_2018;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_2130,"hx_n");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1ef8;
        jVar2 = pvVar8->m_value;
        pvVar8->m_value = local_1ef0;
        local_1ef8 = vVar1;
        local_1ef0 = jVar2;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1ef0.boolean,vVar1);
        local_1f08 = number_integer;
        local_1f00 = __n_00;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_2130,"hx_m");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1f08;
        jVar2 = pvVar8->m_value;
        (pvVar8->m_value).number_unsigned = (number_unsigned_t)local_1f00;
        local_1f08 = vVar1;
        local_1f00 = jVar2;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1f00.boolean,vVar1);
        iVar3 = std::__cxx11::string::compare((char *)&local_1eb8);
        if (iVar3 == 0) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1e40,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_2120);
          local_1d40._M_dataplus._M_p = (pointer)&local_1d40.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d40,"lx_filename","");
          local_1d60[0] = local_1d50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d60,"0","");
          json_read_safe((json *)&local_1a60,(string *)local_1e40,&local_1d40);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1aa0,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_1a60);
          local_20c8 = load_alist_cpp(&local_1aa0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1aa0._M_dataplus._M_p != &local_1aa0.field_2) {
            operator_delete(local_1aa0._M_dataplus._M_p,local_1aa0.field_2._M_allocated_capacity + 1
                           );
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
          if (local_1d60[0] != local_1d50) {
            operator_delete(local_1d60[0],local_1d50[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d40._M_dataplus._M_p != &local_1d40.field_2) {
            operator_delete(local_1d40._M_dataplus._M_p,local_1d40.field_2._M_allocated_capacity + 1
                           );
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_1e40 + 8),local_1e40[0]);
          iVar3 = local_20c8->n_rows;
          local_1f10 = (json_value)(long)local_20c8->n_cols;
          local_1f18 = number_integer;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_2130,"lx_n");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f18;
          jVar2 = pvVar8->m_value;
          pvVar8->m_value = local_1f10;
          local_1f18 = vVar1;
          local_1f10 = jVar2;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1f10.boolean,vVar1);
          local_1f28 = number_integer;
          local_1f20 = (json_value)(long)iVar3;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_2130,"lx_k");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f28;
          jVar2 = pvVar8->m_value;
          pvVar8->m_value = local_1f20;
          local_1f28 = vVar1;
          local_1f20 = jVar2;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1f20.boolean,vVar1);
          poVar13 = local_20b8;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_1eb8);
        if (iVar3 == 0) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1e50,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_2120);
          local_1d80._M_dataplus._M_p = (pointer)&local_1d80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d80,"hz_filename","");
          local_1da0._M_allocated_capacity = (size_type)local_1d90;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1da0,"0","");
          json_read_safe((json *)&local_1a60,(string *)local_1e50,&local_1d80);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1ac0,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_1a60);
          local_20c0 = load_alist_cpp(&local_1ac0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1ac0._M_dataplus._M_p != &local_1ac0.field_2) {
            operator_delete(local_1ac0._M_dataplus._M_p,local_1ac0.field_2._M_allocated_capacity + 1
                           );
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1a58.boolean,local_1a60.boolean);
          if ((long *)local_1da0._M_allocated_capacity != local_1d90) {
            operator_delete((void *)local_1da0._M_allocated_capacity,local_1d90[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d80._M_dataplus._M_p != &local_1d80.field_2) {
            operator_delete(local_1d80._M_dataplus._M_p,local_1d80.field_2._M_allocated_capacity + 1
                           );
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_1e50 + 8),local_1e50[0]);
          iVar3 = local_20c0->n_rows;
          local_1f30 = (json_value)(long)local_20c0->n_cols;
          local_1f38 = number_integer;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_2130,"hz_n");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f38;
          jVar2 = pvVar8->m_value;
          pvVar8->m_value = local_1f30;
          local_1f38 = vVar1;
          local_1f30 = jVar2;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1f30.boolean,vVar1);
          local_1f48 = number_integer;
          local_1f40 = (json_value)(long)iVar3;
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_2130,"hz_m");
          vVar1 = pvVar8->m_type;
          pvVar8->m_type = local_1f48;
          jVar2 = pvVar8->m_value;
          pvVar8->m_value = local_1f40;
          local_1f48 = vVar1;
          local_1f40 = jVar2;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&local_1f40.boolean,vVar1);
          poVar13 = local_20b8;
        }
        bp_osd::bp_osd(&local_1860,local_2020,local_2010,(int)local_2110,(double)iVar5,
                       local_2100._0_4_,iVar4);
        local_1f50 = (json_value)(long)local_1860.max_iter;
        local_1f58 = number_integer;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_2130,"max_iter");
        __n = local_2018;
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1f58;
        jVar2 = pvVar8->m_value;
        pvVar8->m_value = local_1f50;
        local_1f58 = vVar1;
        local_1f50 = jVar2;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1f50.boolean,vVar1);
        local_1f68 = number_unsigned;
        local_1f60 = (json_value)local_1860.encoding_input_count;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_2130,"osdw_encoding_operator_count");
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_1f68;
        jVar2 = pvVar8->m_value;
        pvVar8->m_value = local_1f60;
        local_1f68 = vVar1;
        local_1f60 = jVar2;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_1f60.boolean,vVar1);
        pcVar9 = (char *)operator_new__(__n.number_unsigned);
        memset(pcVar9,0,__n.number_unsigned);
        local_1f88 = (char *)operator_new__(__n_00.number_unsigned);
        memset(local_1f88,0,__n_00.number_unsigned);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Simulating ",0xb);
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," error correction cycles...",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (poVar13 != (object_t *)0x0) {
          local_2088 = (double)CONCAT44(local_2088._4_4_,(int)local_2108.number_float);
          local_1e60 = _VTT;
          local_1e68 = _log;
          uVar11 = local_2018.number_unsigned & 0xffffffff;
          local_2110 = (object_t *)0x1;
          local_1f80.object = (object_t *)0x0;
          local_20b0.object = (object_t *)0x0;
          local_2108.object = (object_t *)0x0;
          local_2100.object = (object_t *)0x0;
          do {
            if ((int)local_2018._0_4_ < 1) {
LAB_001131b4:
              local_20b0.object = (object_t *)&((local_20b0.object)->_M_t)._M_impl.field_0x1;
              local_2108.object = (object_t *)&((local_2108.object)->_M_t)._M_impl.field_0x1;
              local_2100.object = (object_t *)&((local_2100.object)->_M_t)._M_impl.field_0x1;
            }
            else {
              bVar15 = true;
              uVar12 = 0;
              do {
                dVar16 = genRand((MTRand *)local_13b8);
                poVar13 = local_20b8;
                pcVar9[uVar12] = dVar16 < local_2010;
                if (dVar16 < local_2010) {
                  bVar15 = false;
                }
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
              if (bVar15) goto LAB_001131b4;
              syndrome(local_2020,pcVar9,local_1f88);
              decoding = bp_osd::bp_osd_decode(&local_1860,local_1f88);
              iVar5 = std::__cxx11::string::compare((char *)&local_1eb8);
              if (iVar5 == 0) {
                iVar5 = check_logical_error_lx(local_20c8,pcVar9,decoding);
              }
              else {
                iVar5 = check_logical_error_hz(local_20c0,pcVar9,decoding);
              }
              local_2100.object =
                   (object_t *)(&((local_2100.object)->_M_t)._M_impl.field_0x0 + (iVar5 == 0));
              iVar5 = std::__cxx11::string::compare((char *)&local_1eb8);
              if (iVar5 == 0) {
                iVar5 = check_logical_error_lx(local_20c8,pcVar9,local_1860.osd0_decoding);
              }
              else {
                iVar5 = check_logical_error_hz(local_20c0,pcVar9,local_1860.osd0_decoding);
              }
              local_2108.object =
                   (object_t *)(&((local_2108.object)->_M_t)._M_impl.field_0x0 + (iVar5 == 0));
              if (*local_1860.converge == 1) {
                iVar5 = std::__cxx11::string::compare((char *)&local_1eb8);
                if (iVar5 == 0) {
                  iVar5 = check_logical_error_lx(local_20c8,pcVar9,local_1860.bp_decoding);
                }
                else {
                  iVar5 = check_logical_error_hz(local_20c0,pcVar9,local_1860.bp_decoding);
                }
                local_1f80.object = (object_t *)&((local_1f80.object)->_M_t)._M_impl.field_0x1;
                local_20b0.object =
                     (object_t *)(&((local_20b0.object)->_M_t)._M_impl.field_0x0 + (iVar5 == 0));
              }
            }
            dVar16 = timing::elapsed_time_seconds(&local_17e8);
            if ((local_2110 == poVar13) || (3.0 < dVar16 - (double)local_2088._0_4_)) {
              local_1e58 = timing::elapsed_time_seconds(&local_17e8);
              local_2030 = number_unsigned;
              local_2028.object = local_2110;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"run_count");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_2030;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).object = (object_t *)local_2028;
              local_2030 = vVar1;
              local_2028 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_2028.boolean,vVar1);
              local_2040 = number_unsigned;
              local_2038 = local_2100;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"osdw_success_count");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_2040;
              jVar2 = pvVar8->m_value;
              pvVar8->m_value = local_2038;
              local_2040 = vVar1;
              local_2038 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_2038.boolean,vVar1);
              local_2050 = number_unsigned;
              local_2048 = local_2108;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"osd0_success_count");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_2050;
              jVar2 = pvVar8->m_value;
              pvVar8->m_value = local_2048;
              local_2050 = vVar1;
              local_2048 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_2048.boolean,vVar1);
              local_2060 = number_unsigned;
              local_2058 = local_20b0;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"bp_success_count");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_2060;
              jVar2 = pvVar8->m_value;
              pvVar8->m_value = local_2058;
              local_2060 = vVar1;
              local_2058 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_2058.boolean,vVar1);
              local_2070 = number_unsigned;
              local_2068 = local_1f80;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"bp_converge_count");
              dStack_2080 = (double)CONCAT44(0x45300000,(int)((ulong)local_2110 >> 0x20)) -
                            1.9342813113834067e+25;
              local_2088 = dStack_2080 +
                           ((double)CONCAT44(0x43300000,(int)local_2110) - 4503599627370496.0);
              local_1f70 = 1.0 - (((double)CONCAT44(0x45300000,(int)((ulong)local_2100 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)local_2100.number_integer) -
                                 4503599627370496.0)) / local_2088;
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_2070;
              jVar2 = pvVar8->m_value;
              pvVar8->m_value = local_2068;
              local_2070 = vVar1;
              local_2068 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_2068.boolean,vVar1);
              local_20d8 = number_float;
              local_1a60.number_float = local_1f70;
              local_20d0.number_float = local_1f70;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"osdw_ler");
              local_1f78 = 1.0 - (((double)CONCAT44(0x45300000,(int)((ulong)local_2108 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)local_2108.number_integer) -
                                 4503599627370496.0)) / local_2088;
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_20d8;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).number_float = (number_float_t)local_20d0;
              local_20d8 = vVar1;
              local_20d0 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_20d0.boolean,vVar1);
              local_20e8 = number_float;
              local_1a60.number_float = local_1f78;
              local_20e0.number_float = local_1f78;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"osd0_ler");
              local_2088 = 1.0 - (((double)CONCAT44(0x45300000,(int)((ulong)local_20b0 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)local_20b0.number_integer) -
                                 4503599627370496.0)) / local_2088;
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_20e8;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).number_float = (number_float_t)local_20e0;
              local_20e8 = vVar1;
              local_20e0 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_20e0.boolean,vVar1);
              local_20f8 = number_float;
              local_1a60.number_float = local_2088;
              local_20f0.number_float = local_2088;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"bp_ler");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_20f8;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).number_float = (number_float_t)local_20f0;
              local_20f8 = vVar1;
              local_20f0 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_20f0.boolean,vVar1);
              local_2090.number_float = timing::elapsed_time_seconds(&local_17e8);
              local_2098 = number_float;
              local_1a60.number_float = local_2090.number_float;
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"runtime_seconds");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_2098;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).number_float = (number_float_t)local_2090;
              local_2098 = vVar1;
              local_2090 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_2090.boolean,vVar1);
              local_1a60.object = (object_t *)timing::elapsed_time_readable(&local_17e8);
              local_20a0.object = (object_t *)0x0;
              local_20a8 = string;
              local_20a0.object =
                   (object_t *)
                   nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::create<std::__cxx11::string,char*const&>((char **)&local_1a60.object);
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"runtime_readable");
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_20a8;
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).object = (object_t *)local_20a0;
              local_20a8 = vVar1;
              local_20a0 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_20a0.boolean,vVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Runs: ",6);
              poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; OSDW_LER: ",0xc);
              poVar7 = std::ostream::_M_insert<double>(local_1f70);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; OSD0_LER: ",0xc);
              poVar7 = std::ostream::_M_insert<double>(local_1f78);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; BP_LER: ",10);
              poVar7 = std::ostream::_M_insert<double>(local_2088);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; Runtime: ",0xb);
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_2130,"runtime_readable");
              poVar7 = nlohmann::operator<<(poVar7,pvVar8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              std::ofstream::ofstream(&local_1a60,(string *)&local_2008,_S_trunc);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2008._M_dataplus._M_p != &local_2008.field_2) {
                operator_delete(local_2008._M_dataplus._M_p,
                                local_2008.field_2._M_allocated_capacity + 1);
              }
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_2008,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2130,1,' ',false,strict);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a60.boolean,local_2008._M_dataplus._M_p,
                         local_2008._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2008._M_dataplus._M_p != &local_2008.field_2) {
                operator_delete(local_2008._M_dataplus._M_p,
                                local_2008.field_2._M_allocated_capacity + 1);
              }
              std::ofstream::close();
              local_2088 = (double)CONCAT44(local_2088._4_4_,(int)local_1e58);
              local_1a60.number_integer = (number_integer_t)local_1e60;
              *(undefined8 *)
               (&local_1a60.boolean +
               (long)*(_Base_ptr *)
                      ((long)&local_1e60[-1]._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)) =
                   local_1e68;
              std::filebuf::~filebuf((filebuf *)&local_1a58.boolean);
              std::ios_base::~ios_base(local_1968);
            }
            local_2110 = (object_t *)&(local_2110->_M_t)._M_impl.field_0x1;
          } while (local_2110 <= poVar13);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1748);
        std::ios_base::~ios_base(local_16c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ce0._M_dataplus._M_p != &local_1ce0.field_2) {
          operator_delete(local_1ce0._M_dataplus._M_p,local_1ce0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e88._M_dataplus._M_p != &local_1e88.field_2) {
          operator_delete(local_1e88._M_dataplus._M_p,local_1e88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ee8._M_dataplus._M_p != &local_1ee8.field_2) {
          operator_delete(local_1ee8._M_dataplus._M_p,local_1ee8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1fa8._M_dataplus._M_p != &local_1fa8.field_2) {
          operator_delete(local_1fa8._M_dataplus._M_p,local_1fa8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1eb8._M_dataplus._M_p != &local_1eb8.field_2) {
          operator_delete(local_1eb8._M_dataplus._M_p,local_1eb8.field_2._M_allocated_capacity + 1);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_2130 + 8),(value_t)local_2130[0]);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_2120 + 8),local_2120[0]);
        std::ifstream::~ifstream(local_15c0);
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ERROR: Please select a valid method for verifying the recovered error. `lx\' or `hz\'."
                 ,0x54);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00113ba2;
    }
    pcVar9 = "ERROR: Please provide a location for the output directory";
  }
  poVar7 = std::operator<<((ostream *)&std::cout,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_00113ba2:
  exit(0x16);
}

Assistant:

int main(int argc, char *argv[])
{

    if(argv[1]==nullptr){
        cout<<"ERROR: Please provide a location for the input directory"<<endl;
        exit(22);
    };

    if(argv[2]==nullptr){
        cout<<"ERROR: Please provide a location for the output directory"<<endl;
        exit(22);
    };

//    if(argv[3]==nullptr){
//        cout<<"ERROR: Please select a method for verifying the recovered error"<<endl;
//        exit(22);
//    } else if ( strcmp(argv[3],"-lx") != 0 && strcmp(argv[3],"-hz") != 0  ) {
//        cout<<"ERROR: Please select a valid method for verifying the recovered error"<<endl;
//        exit(22);
//    };

    //timing functions setup
    timing time;
    cout<<"Start time: "<<time.start_time_string<<endl;
    cout<<"Input file: "<<argv[1]<<endl;
    int elapsed_seconds;
    elapsed_seconds=time.elapsed_time_seconds();

    //read in json input file
    ifstream json_input_file(argv[1]);
    json json_input;
    json_input_file>>json_input;
    cout<<json_input.dump(1)<<endl;
    json output=json_input;

    //get input file from command line arguments
    output["input_file"]=argv[1];

    //setup random number generator
    int random_seed = json_read_safe(output,"input_seed");
    MTRand r=setup_mtwister_rng(random_seed);

    //save start time
    output["start_time"] = time.start_time_string;

    //generate UI from start time + random seed
    unsigned long long int ui =time.start_time_seconds+random_seed;
    output["ui"]=ui;

    //read in sim parameters
    double bit_error_rate=json_read_safe(json_input,"bit_error_rate");
    int osd_order = json_read_safe(json_input,"osd_order");
    int max_iter=json_read_safe(json_input,"max_iter");
    long long unsigned int target_runs=json_read_safe(json_input,"target_runs");

    //read in Logical check method
    string logical_check_method = json_read_safe(json_input,"logical_check_method","lx");
    if((logical_check_method=="lx")||(logical_check_method=="hz")) 1;
    else{
        cout<<"ERROR: Please select a valid method for verifying the recovered error. `lx' or `hz'."<<endl;
        exit(22);
    }

    //read in OSD method and check that it is valid
    string osd_method = json_read_safe(json_input,"osd_method");
    int osd_method_i=-1;
    if((osd_method=="exhaustive")||(osd_method=="osd_e")) osd_method_i=0;
    else if((osd_method=="combination_sweep")||(osd_method=="osd_cs")) osd_method_i=1;
    else if(osd_method=="osd_0"){
        osd_method_i=2;
        output["osd_order"]=0;
    }
    else if(osd_method=="osd_g") osd_method_i=3;
    else{
        cout<<"ERROR: Invalid OSD method: "<<osd_method<<endl;
        exit(22);
    }
    if(osd_order==0){
        osd_method="osd_0";
        output["osd_method"]=osd_method;
        osd_method_i=2;
    }

    //read in BP method and check that it is valid
    string bp_method = json_read_safe(json_input,"bp_method","min_sum");
    int bp_method_i=-1;
    if(bp_method=="min_sum") bp_method_i=0;
    else if(bp_method=="min_sum_min_synd") bp_method_i=1;
    else if(bp_method=="product_sum") bp_method_i=2;
    else if(bp_method=="product_sum_min_synd") bp_method_i=3;
    else{
        cout<<"ERROR: Invalid BP method: "<<bp_method<<endl;
        exit(22);
    }
    output["bp_method"]=bp_method;

    

    //set up output file
    string p_label =to_string(bit_error_rate);
    replace( p_label.begin(), p_label.end(), '.', '_');
    string label =output["code_label"];
    stringstream output_filename;
    output_filename<<argv[2]<<"/"<<label<<";p:"<<p_label<<";ui:"<<ui<<".json";
    cout<<"\nOutput filename: "<< output_filename.str() <<endl;


    //LOAD ALIST FILES
    cout<<"\nLoading alist files"<<endl;

    //load hx parity check matrix
    mod2sparse *hx=load_alist_cpp(json_read_safe(json_input,"hx_filename"));
    int hx_m=mod2sparse_rows(hx);
    int hx_n=mod2sparse_cols(hx);
    output["hx_n"]=hx_n;
    output["hx_m"]=hx_m;

    //load logical check matrix, lx
    mod2sparse *lx;
    if(logical_check_method=="lx") {
        lx = load_alist_cpp(json_read_safe(json_input, "lx_filename"));
        int lx_k = mod2sparse_rows(lx);
        int lx_n = mod2sparse_cols(lx);
        output["lx_n"] = lx_n;
        output["lx_k"] = lx_k;
        assert(lx_n == hx_n);
    }

    mod2sparse *hz;
    if(logical_check_method=="hz") {
        hz=load_alist_cpp(json_read_safe(json_input,"hz_filename"));
        int hz_m=mod2sparse_rows(hz);
        int hz_n=mod2sparse_cols(hz);
        output["hz_n"]=hz_n;
        output["hz_m"]=hz_m;
        assert(hz_n==hx_n);
    }


    //Setup BP+OSD decoder for hx
    bp_osd hx_bp_osd(hx,bit_error_rate,max_iter,osd_order,osd_method_i,bp_method_i);
    output["max_iter"]=hx_bp_osd.max_iter;
    output["osdw_encoding_operator_count"]=hx_bp_osd.encoding_input_count;


    //MEMORY ALLOCATION (we can do this now that we know the size of the matrices we are dealing with!)
    double *soft_decisions = new double[hx_n]();
    char *bit_error = new char[hx_n]();
    char *bp_decoding = new char[hx_n]();
    char *osd_decoding = new char[hx_n]();
    char *osdw_decoding = new char[hx_n]();
    char *bit_syndrome = new char[hx_m]();

    //declarations for various simulation variables
    long long unsigned int bp_converge_count=0;
    long long unsigned int bp_success_count=0;
    long long unsigned int osd0_success_count=0;
    long long unsigned int osdw_success_count=0;
    bool logical_error;
    bool zero_error;
    double osdw_ler;
    double osd0_ler;
    double bp_ler;



    //MAIN SIM LOOP

    cout<<endl;
    cout<<"Simulating "<<target_runs<<" error correction cycles..."<<endl;
    for(long long unsigned int run_count=1; run_count <= target_runs; run_count++) {

        //generate error
        zero_error=true;
        for (int bit_no = 0; bit_no < hx_n; bit_no++) {
            bit_error[bit_no] = genRand(&r) < bit_error_rate;
            if(bit_error[bit_no]==1) zero_error=false;
        }

        //Skip decoding if generated error is a zero vector.
        if(zero_error) {
            bp_success_count++;
            osd0_success_count++;
            osdw_success_count++;
        }
        else {
            //calculate syndrome
            syndrome(hx, bit_error, bit_syndrome);

            //decode
            osdw_decoding = hx_bp_osd.bp_osd_decode(bit_syndrome);


            //check for logical errors
            if (logical_check_method=="lx") {
                logical_error = check_logical_error_lx(lx, bit_error, osdw_decoding);
            } else {
                logical_error = check_logical_error_hz(hz, bit_error, osdw_decoding);
            }

            if (!logical_error) osdw_success_count++;
            
//            osdw_decoding = hx_bp_osd.osd0_decoding;
            if (logical_check_method=="lx") {
                logical_error = check_logical_error_lx(lx, bit_error, hx_bp_osd.osd0_decoding);
            } else {
                logical_error = check_logical_error_hz(hz, bit_error, hx_bp_osd.osd0_decoding);
            }
            
            if (!logical_error) osd0_success_count++;

            if (*hx_bp_osd.converge == 1) {
                bp_converge_count++;

                if (logical_check_method=="lx") {
                    logical_error = check_logical_error_lx(lx, bit_error, hx_bp_osd.bp_decoding);
                } else {
                    logical_error = check_logical_error_hz(hz, bit_error, hx_bp_osd.bp_decoding);
                }

                if (!logical_error) bp_success_count++;
            }
        }


        //write to output every 3 seconds. Change this as you see fit
        if((time.elapsed_time_seconds()-elapsed_seconds>3) | (run_count==target_runs) ){

            //calculate logical error rates
            osdw_ler= 1.0 - osdw_success_count / (double(run_count));
            osd0_ler= 1.0 - osd0_success_count / (double(run_count));
            bp_ler= 1.0 - bp_success_count / (double(run_count));

            elapsed_seconds=time.elapsed_time_seconds();

            output["run_count"] = run_count;
            output["osdw_success_count"]=osdw_success_count;
            output["osd0_success_count"]=osd0_success_count;
            output["bp_success_count"]=bp_success_count;
            output["bp_converge_count"]=bp_converge_count;
            output["osdw_ler"] = osdw_ler;
            output["osd0_ler"] = osd0_ler;
            output["bp_ler"] = bp_ler;
            output["runtime_seconds"] = time.elapsed_time_seconds();
            output["runtime_readable"] = time.elapsed_time_readable();
            cout << "Runs: " << run_count << "; OSDW_LER: " << osdw_ler << "; OSD0_LER: " << osd0_ler << "; BP_LER: " << bp_ler << "; Runtime: " << output["runtime_readable"] << endl;

            //command line output
            ofstream output_file(output_filename.str(),ofstream::trunc);
            output_file<<output.dump(1);
            output_file.close();

        }





    }



}